

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_manager.cc
# Opt level: O0

RC __thiscall PF_Manager::CloseFile(PF_Manager *this,PF_FileHandle *fileHandle)

{
  int iVar1;
  RC rc;
  PF_FileHandle *fileHandle_local;
  PF_Manager *this_local;
  
  if (fileHandle->bFileOpen == 0) {
    this_local._4_4_ = 5;
  }
  else {
    this_local._4_4_ = PF_FileHandle::FlushPages(fileHandle);
    if (this_local._4_4_ == 0) {
      iVar1 = close(fileHandle->unixfd);
      if (iVar1 < 0) {
        this_local._4_4_ = -0xb;
      }
      else {
        fileHandle->bFileOpen = 0;
        fileHandle->pBufferMgr = (PF_BufferMgr *)0x0;
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_Manager::CloseFile(PF_FileHandle &fileHandle)
{
   RC rc;

   // Ensure fileHandle refers to open file
   if (!fileHandle.bFileOpen)
      return (PF_CLOSEDFILE);

   // Flush all buffers for this file and write out the header
   if ((rc = fileHandle.FlushPages()))
      return (rc);

   // Close the file
   if (close(fileHandle.unixfd) < 0)
      return (PF_UNIX);
   fileHandle.bFileOpen = FALSE;

   // Reset the buffer manager pointer in the file handle
   fileHandle.pBufferMgr = NULL;

   // Return ok
   return 0;
}